

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O2

void src_float_to_int_array(float *in,int *out,int len)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)len;
  if (len < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    fVar1 = in[uVar2] * 2.1474836e+09;
    iVar3 = 0x7fffffff;
    if ((fVar1 < 2.1474836e+09) && (iVar3 = -0x80000000, -2.1474836e+09 < fVar1)) {
      iVar3 = (int)ROUND(fVar1);
    }
    out[uVar2] = iVar3;
  }
  return;
}

Assistant:

void
src_float_to_int_array (const float *in, int *out, int len)
{	double scaled_value ;

	for (int i = 0 ; i < len ; i++)
	{	scaled_value = in [i] * (8.0 * 0x10000000) ;
#if CPU_CLIPS_POSITIVE == 0
		if (scaled_value >= (1.0 * 0x7FFFFFFF))
		{	out [i] = 0x7fffffff ;
			continue ;
			} ;
#endif
#if CPU_CLIPS_NEGATIVE == 0
		if (scaled_value <= (-8.0 * 0x10000000))
		{	out [i] = -1 - 0x7fffffff ;
			continue ;
			} ;
#endif
		out [i] = (int) psf_lrint (scaled_value) ;
		} ;

}